

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::ApplicationInfoFilter::Impl::test_application_info(Impl *this,VkApplicationInfo *info)

{
  uint uVar1;
  char *pcVar2;
  FILE *pFVar3;
  size_type sVar4;
  vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_> *pvVar5;
  pointer ppVar6;
  reference info_00;
  undefined8 uVar7;
  bool bVar8;
  EnvInfo *env_info_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_> *__range3_1;
  allocator local_f1;
  key_type local_f0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
  local_d0;
  iterator itr_1;
  EnvInfo *env_info;
  iterator __end3;
  iterator __begin3;
  vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_> *__range3;
  allocator local_99;
  key_type local_98;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
  local_78;
  iterator itr;
  key_type local_68;
  byte local_43;
  byte local_42;
  allocator local_41;
  key_type local_40;
  VkApplicationInfo *local_20;
  VkApplicationInfo *info_local;
  Impl *this_local;
  
  if (info == (VkApplicationInfo *)0x0) {
    this_local._7_1_ = true;
  }
  else {
    local_42 = 0;
    local_43 = 0;
    bVar8 = false;
    local_20 = info;
    info_local = (VkApplicationInfo *)this;
    if (info->pApplicationName != (char *)0x0) {
      pcVar2 = info->pApplicationName;
      std::allocator<char>::allocator();
      local_42 = 1;
      std::__cxx11::string::string((string *)&local_40,pcVar2,&local_41);
      local_43 = 1;
      sVar4 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->blacklisted_application_names,&local_40);
      bVar8 = sVar4 != 0;
    }
    if ((local_43 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_40);
    }
    if ((local_42 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    if (bVar8) {
      fprintf(_stderr,
              "Fossilize INFO: pApplicationName %s is blacklisted for recording. Skipping.\n",
              local_20->pApplicationName);
      this_local._7_1_ = false;
    }
    else {
      itr.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
      ._M_cur._6_1_ = 0;
      itr.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
      ._M_cur._5_1_ = 0;
      bVar8 = false;
      if (local_20->pEngineName != (char *)0x0) {
        pcVar2 = local_20->pEngineName;
        std::allocator<char>::allocator();
        itr.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
        ._M_cur._6_1_ = 1;
        std::__cxx11::string::string
                  ((string *)&local_68,pcVar2,
                   (allocator *)
                   ((long)&itr.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                           ._M_cur + 7));
        itr.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
        ._M_cur._5_1_ = 1;
        sVar4 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&this->blacklisted_engine_names,&local_68);
        bVar8 = sVar4 != 0;
      }
      if ((itr.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
           ._M_cur._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_68);
      }
      if ((itr.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
           ._M_cur._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&itr.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                           ._M_cur + 7));
      }
      if (bVar8) {
        fprintf(_stderr,"Fossilize INFO: pEngineName %s is blacklisted for recording. Skipping.\n",
                local_20->pEngineName);
        this_local._7_1_ = false;
      }
      else {
        if (local_20->pApplicationName != (char *)0x0) {
          pcVar2 = local_20->pApplicationName;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_98,pcVar2,&local_99);
          local_78._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>_>
               ::find(&this->application_infos,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          std::allocator<char>::~allocator((allocator<char> *)&local_99);
          __range3 = (vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_> *)
                     std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>_>
                     ::end(&this->application_infos);
          bVar8 = std::__detail::operator!=
                            (&local_78,
                             (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                              *)&__range3);
          if (bVar8) {
            uVar1 = local_20->applicationVersion;
            ppVar6 = std::__detail::
                     _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
                     ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
                                   *)&local_78);
            if (uVar1 < (ppVar6->second).minimum_application_version) {
              fprintf(_stderr,
                      "Fossilize INFO: applicationVersion %u is too low for pApplicationName %s. Skipping.\n"
                      ,(ulong)local_20->applicationVersion,local_20->pApplicationName);
              return false;
            }
            uVar1 = local_20->apiVersion;
            ppVar6 = std::__detail::
                     _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
                     ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
                                   *)&local_78);
            if (uVar1 < (ppVar6->second).minimum_api_version) {
              fprintf(_stderr,
                      "Fossilize INFO: apiVersion %u is too low for pApplicationName %s. Skipping.\n"
                      ,(ulong)local_20->apiVersion,local_20->pApplicationName);
              return false;
            }
            ppVar6 = std::__detail::
                     _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
                     ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
                                   *)&local_78);
            pvVar5 = &(ppVar6->second).env_infos;
            __end3 = std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>::begin
                               (pvVar5);
            env_info = (EnvInfo *)
                       std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>::end
                                 (pvVar5);
            while (bVar8 = __gnu_cxx::operator!=
                                     (&__end3,(__normal_iterator<Fossilize::EnvInfo_*,_std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>_>
                                               *)&env_info), bVar8) {
              itr_1.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
              ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                         )__gnu_cxx::
                          __normal_iterator<Fossilize::EnvInfo_*,_std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>_>
                          ::operator*(&__end3);
              bVar8 = filter_env_info(this,(EnvInfo *)
                                           itr_1.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                                           ._M_cur);
              pFVar3 = _stderr;
              if (bVar8) {
                uVar7 = std::__cxx11::string::c_str();
                fprintf(pFVar3,
                        "Fossilize INFO: Skipping recording due to environment rule for: %s.\n",
                        uVar7);
                return false;
              }
              __gnu_cxx::
              __normal_iterator<Fossilize::EnvInfo_*,_std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>_>
              ::operator++(&__end3);
            }
          }
        }
        if (local_20->pEngineName != (char *)0x0) {
          pcVar2 = local_20->pEngineName;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_f0,pcVar2,&local_f1);
          local_d0._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>_>
               ::find(&this->engine_infos,&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_f1);
          __range3_1 = (vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_> *)
                       std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>_>
                       ::end(&this->engine_infos);
          bVar8 = std::__detail::operator!=
                            (&local_d0,
                             (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                              *)&__range3_1);
          if (bVar8) {
            uVar1 = local_20->engineVersion;
            ppVar6 = std::__detail::
                     _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
                     ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
                                   *)&local_d0);
            if (uVar1 < (ppVar6->second).minimum_engine_version) {
              fprintf(_stderr,
                      "Fossilize INFO: engineVersion %u is too low for pEngineName %s. Skipping.\n",
                      (ulong)local_20->engineVersion,local_20->pEngineName);
              return false;
            }
            uVar1 = local_20->apiVersion;
            ppVar6 = std::__detail::
                     _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
                     ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
                                   *)&local_d0);
            if (uVar1 < (ppVar6->second).minimum_api_version) {
              fprintf(_stderr,
                      "Fossilize INFO: apiVersion %u is too low for pEngineName %s. Skipping.\n",
                      (ulong)local_20->apiVersion,local_20->pEngineName);
              return false;
            }
            ppVar6 = std::__detail::
                     _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
                     ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
                                   *)&local_d0);
            pvVar5 = &(ppVar6->second).env_infos;
            __end3_1 = std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>::begin
                                 (pvVar5);
            env_info_1 = (EnvInfo *)
                         std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>::end
                                   (pvVar5);
            while (bVar8 = __gnu_cxx::operator!=
                                     (&__end3_1,
                                      (__normal_iterator<Fossilize::EnvInfo_*,_std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>_>
                                       *)&env_info_1), bVar8) {
              info_00 = __gnu_cxx::
                        __normal_iterator<Fossilize::EnvInfo_*,_std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>_>
                        ::operator*(&__end3_1);
              bVar8 = filter_env_info(this,info_00);
              pFVar3 = _stderr;
              if (bVar8) {
                uVar7 = std::__cxx11::string::c_str();
                fprintf(pFVar3,
                        "Fossilize INFO: Skipping recording due to environment rule for: %s.\n",
                        uVar7);
                return false;
              }
              __gnu_cxx::
              __normal_iterator<Fossilize::EnvInfo_*,_std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>_>
              ::operator++(&__end3_1);
            }
          }
        }
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ApplicationInfoFilter::Impl::test_application_info(const VkApplicationInfo *info)
{
	// No app info, just assume true.
	if (!info)
		return true;

	// First, check for blacklists.
	if (info->pApplicationName && blacklisted_application_names.count(info->pApplicationName))
	{
		LOGI("pApplicationName %s is blacklisted for recording. Skipping.\n", info->pApplicationName);
		return false;
	}

	if (info->pEngineName && blacklisted_engine_names.count(info->pEngineName))
	{
		LOGI("pEngineName %s is blacklisted for recording. Skipping.\n", info->pEngineName);
		return false;
	}

	// Check versioning for applicationName.
	if (info->pApplicationName)
	{
		auto itr = application_infos.find(info->pApplicationName);
		if (itr != application_infos.end())
		{
			if (info->applicationVersion < itr->second.minimum_application_version)
			{
				LOGI("applicationVersion %u is too low for pApplicationName %s. Skipping.\n",
				     info->applicationVersion, info->pApplicationName);
				return false;
			}

			if (info->apiVersion < itr->second.minimum_api_version)
			{
				LOGI("apiVersion %u is too low for pApplicationName %s. Skipping.\n",
				     info->apiVersion, info->pApplicationName);
				return false;
			}

			for (auto &env_info : itr->second.env_infos)
			{
				if (filter_env_info(env_info))
				{
					LOGI("Skipping recording due to environment rule for: %s.\n", env_info.env.c_str());
					return false;
				}
			}
		}
	}

	// Check versioning for engineName.
	if (info->pEngineName)
	{
		auto itr = engine_infos.find(info->pEngineName);
		if (itr != engine_infos.end())
		{
			if (info->engineVersion < itr->second.minimum_engine_version)
			{
				LOGI("engineVersion %u is too low for pEngineName %s. Skipping.\n",
				     info->engineVersion, info->pEngineName);
				return false;
			}

			if (info->apiVersion < itr->second.minimum_api_version)
			{
				LOGI("apiVersion %u is too low for pEngineName %s. Skipping.\n",
				     info->apiVersion, info->pEngineName);
				return false;
			}

			for (auto &env_info : itr->second.env_infos)
			{
				if (filter_env_info(env_info))
				{
					LOGI("Skipping recording due to environment rule for: %s.\n", env_info.env.c_str());
					return false;
				}
			}
		}
	}

	// We didn't fail any filter, so we should record.
	return true;
}